

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steepestedgepricing.hpp
# Opt level: O0

void __thiscall
SteepestEdgePricing::update_weights
          (SteepestEdgePricing *this,QpVector *aq,QpVector *ep,HighsInt p,HighsInt q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  vector<int,_std::allocator<int>_> *this_00;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  double dVar7;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  double dVar8;
  double new_weight_p_updated;
  double t_i;
  HighsInt in_stack_00000038;
  HighsInt i;
  double t_p;
  double weight_p;
  double old_weight_p_computed;
  QpVector delta;
  HighsInt rowindex_p;
  QpVector *in_stack_ffffffffffffff50;
  QpVector *in_stack_ffffffffffffff78;
  value_type vVar9;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar10;
  vector<double,_std::allocator<double>_> vStack_40;
  value_type local_24;
  int local_1c;
  long local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  this_00 = Basis::getindexinfactor(*(Basis **)(in_RDI + 0x10));
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_1c);
  local_24 = *pvVar4;
  Basis::ftran((Basis *)weight_p,(QpVector *)t_p,i._3_1_,in_stack_00000038);
  dVar8 = QpVector::dot((QpVector *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),(long)local_24);
  dVar1 = *pvVar5;
  for (iVar10 = 0; iVar10 < *(int *)(*(long *)(in_RDI + 8) + 4); iVar10 = iVar10 + 1) {
    if (iVar10 != local_24) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),(long)iVar10)
      ;
      vVar9 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar10);
      dVar2 = *pvVar6;
      in_stack_ffffffffffffff50 = (QpVector *)((vVar9 / dVar1) * 2.0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&vStack_40,(long)iVar10);
      dVar3 = *pvVar6;
      dVar7 = -(double)in_stack_ffffffffffffff50;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar10);
      *pvVar6 = ((vVar9 * vVar9) / (dVar1 * dVar1)) * dVar8 + dVar7 * dVar3 + dVar2;
    }
  }
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)local_24);
  *pvVar6 = dVar8 / (dVar1 * dVar1);
  QpVector::~QpVector(in_stack_ffffffffffffff50);
  return;
}

Assistant:

void update_weights(const QpVector& aq, const QpVector& ep, HighsInt p,
                      HighsInt q) {
    HighsInt rowindex_p = basis.getindexinfactor()[p];
    // printf("Update weights, p = %d, rowindex = %d, q = %d\n", p, rowindex_p,
    // q);

    // if (!check_weights()) {
    //   printf("weight check failed\n");
    //   exit(1);
    // }

    QpVector delta = basis.ftran(aq);

    // double old_weight_p_updated = weights[rowindex_p];
    //  exact weight coming in needs to come in before update.
    double old_weight_p_computed = ep.dot(ep);

    // if (fabs(old_weight_p_computed - old_weight_p_updated) >= 1e-2) {
    //   printf("old weight[p] discrepancy: updated = %lf, computed=%lf\n",
    //   old_weight_p_updated, old_weight_p_computed);
    // }

    double weight_p = old_weight_p_computed;

    double t_p = aq.value[rowindex_p];
    for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
      if (i != rowindex_p) {
        double t_i = aq.value[i];
        weights[i] = weights[i] - 2 * (t_i / t_p) * delta.value[i] +
                     ((t_i * t_i) / (t_p * t_p)) * weight_p;
        // printf("weights[%d] = %lf\n", i, weights[i]);
      }
    }
    // QpVector new_ep = basis.btran(QpVector::unit(runtime.instance.num_var,
    // rowindex_p)); double computed_weight = new_ep.dot(new_ep);
    double new_weight_p_updated = weight_p / (t_p * t_p);

    // if (fabs(updated_weight - computed_weight) > 1e-4) {
    //   printf("updated weight %lf vs computed weight %lf. aq[p] = %lf\n",
    //   updated_weight, computed_weight, t_p); printf("old weight = %lf, aq[p]
    //   = %lf, ^2 = %lf, new weight = %lf\n", weight_p, t_p, t_p*t_p,
    //   updated_weight);
    // }
    weights[rowindex_p] = new_weight_p_updated;
  }